

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler::id_is_phi_variable
          (AnalyzeVariableScopeAccessHandler *this,uint32_t id)

{
  SPIRVariable *pSVar1;
  
  if ((id < (uint)(this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pSVar1 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,id),
     pSVar1 != (SPIRVariable *)0x0)) {
    return pSVar1->phi_variable;
  }
  return false;
}

Assistant:

bool Compiler::AnalyzeVariableScopeAccessHandler::id_is_phi_variable(uint32_t id) const
{
	if (id >= compiler.get_current_id_bound())
		return false;
	auto *var = compiler.maybe_get<SPIRVariable>(id);
	return var && var->phi_variable;
}